

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O1

void Kit_DsdExpandCollectXor_rec(Kit_DsdNtk_t *p,uint iLit,uint *piLitsNew,int *nLitsNew)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  Kit_DsdObj_t *pKVar4;
  ulong uVar5;
  
  if ((int)iLit < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                  ,0xf2,"int Abc_Lit2Var(int)");
  }
  uVar3 = iLit >> 1;
  uVar1 = p->nVars;
  if (uVar3 < (uint)p->nNodes + (uint)uVar1) {
    if (uVar3 < uVar1) {
      pKVar4 = (Kit_DsdObj_t *)0x0;
    }
    else {
      pKVar4 = p->pNodes[(ulong)uVar3 - (ulong)uVar1];
    }
    if ((uVar3 < uVar1) || (((uint)*pKVar4 & 0x1c0) != 0x100)) {
      iVar2 = *nLitsNew;
      *nLitsNew = iVar2 + 1;
      piLitsNew[iVar2] = iLit;
    }
    else {
      pKVar4 = p->pNodes[(ulong)uVar3 - (ulong)uVar1];
      if (0x3ffffff < (uint)*pKVar4) {
        uVar5 = 0;
        do {
          Kit_DsdExpandCollectXor_rec
                    (p,(uint)*(ushort *)((long)&pKVar4[1].field_0x0 + uVar5 * 2),piLitsNew,nLitsNew)
          ;
          uVar5 = uVar5 + 1;
        } while (uVar5 < (uint)*pKVar4 >> 0x1a);
      }
      if ((iLit & 1) != 0) {
        if ((int)*piLitsNew < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                        ,0xf4,"int Abc_LitNot(int)");
        }
        *piLitsNew = *piLitsNew ^ 1;
      }
    }
    return;
  }
  __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kit.h"
                ,0x99,"Kit_DsdObj_t *Kit_DsdNtkObj(Kit_DsdNtk_t *, int)");
}

Assistant:

void Kit_DsdExpandCollectXor_rec( Kit_DsdNtk_t * p, unsigned iLit, unsigned * piLitsNew, int * nLitsNew )
{
    Kit_DsdObj_t * pObj;
    unsigned i, iLitFanin;
    // check the end of the supergate
    pObj = Kit_DsdNtkObj( p, Abc_Lit2Var(iLit) );
    if ( Abc_Lit2Var(iLit) < p->nVars || pObj->Type != KIT_DSD_XOR )
    {
        piLitsNew[(*nLitsNew)++] = iLit;
        return;
    }
    // iterate through the fanins
    pObj = Kit_DsdNtkObj( p, Abc_Lit2Var(iLit) );
    Kit_DsdObjForEachFanin( p, pObj, iLitFanin, i )
        Kit_DsdExpandCollectXor_rec( p, iLitFanin, piLitsNew, nLitsNew );
    // if the literal was complemented, pass the complemented attribute somewhere
    if ( Abc_LitIsCompl(iLit) )
        piLitsNew[0] = Abc_LitNot( piLitsNew[0] );
}